

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall S2BooleanOperation::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  std::
  vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
  ::~vector(&this->tmp_crossings_);
  std::
  vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
  ::~vector(&this->index_crossings_);
  std::
  vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
  ::~vector(&this->input_crossings_);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&this->input_dimensions_);
  std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::~unique_ptr(&this->builder_);
  return;
}

Assistant:

explicit Impl(S2BooleanOperation* op)
      : op_(op), index_crossings_first_region_id_(-1) {
  }